

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

int av1_selfguided_restoration_c
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  long lVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint8_t *puVar6;
  undefined1 *puVar7;
  int32_t *piVar8;
  int iVar9;
  undefined1 *puVar10;
  int32_t *piVar11;
  long lVar12;
  int32_t *piVar13;
  int32_t *piVar14;
  undefined1 *puVar15;
  int dgd_stride_00;
  int32_t *piVar16;
  int32_t aiStack_17be8 [4];
  undefined1 auStack_17bd8 [32384];
  int32_t A_ [8100];
  int32_t dgd32_ [8100];
  
  dgd_stride_00 = width + 6;
  lVar1 = (long)(dgd_stride_00 * 3);
  if (highbd == 0) {
    if (-6 < height) {
      iVar2 = width + 2;
      if (iVar2 < -2) {
        iVar2 = -3;
      }
      iVar3 = -3;
      if (-3 < height + 2) {
        iVar3 = height + 2;
      }
      piVar14 = dgd32_ + (long)dgd_stride_00 * -3 + lVar1;
      puVar6 = dgd8 + (long)dgd_stride * -3 + -3;
      iVar9 = -3;
      do {
        if (-6 < width) {
          lVar5 = 0;
          do {
            piVar14[lVar5] = (uint)puVar6[lVar5];
            lVar5 = lVar5 + 1;
          } while (iVar2 + 4 != (int)lVar5);
        }
        iVar9 = iVar9 + 1;
        piVar14 = piVar14 + dgd_stride_00;
        puVar6 = puVar6 + dgd_stride;
      } while (iVar3 + 1 != iVar9);
    }
  }
  else if (-6 < height) {
    iVar2 = width + 2;
    if (iVar2 < -2) {
      iVar2 = -3;
    }
    iVar3 = -3;
    if (-3 < height + 2) {
      iVar3 = height + 2;
    }
    piVar14 = dgd32_ + (long)dgd_stride_00 * -3 + lVar1;
    lVar5 = (long)dgd8 * 2 + (long)dgd_stride * -6 + -6;
    iVar9 = -3;
    do {
      if (-6 < width) {
        lVar12 = 0;
        do {
          piVar14[lVar12] = (uint)*(ushort *)(lVar5 + lVar12 * 2);
          lVar12 = lVar12 + 1;
        } while (iVar2 + 4 != (int)lVar12);
      }
      iVar9 = iVar9 + 1;
      piVar14 = piVar14 + dgd_stride_00;
      lVar5 = lVar5 + (long)dgd_stride * 2;
    } while (iVar3 + 1 != iVar9);
  }
  piVar14 = dgd32_ + lVar1 + 3;
  if ((0 < av1_sgr_params[sgr_params_idx].r[0]) &&
     (calculate_intermediate_result
                (piVar14,width,height,dgd_stride_00,bit_depth,sgr_params_idx,0,1,A_,aiStack_17be8),
     0 < height)) {
    iVar2 = (width + 9U & 0xfffffffc) + 0x10;
    lVar1 = (long)iVar2;
    lVar12 = (long)(iVar2 * 3);
    puVar7 = auStack_17bd8 + lVar12 * 4;
    lVar5 = lVar1 * 4;
    piVar8 = A_ + lVar12 + 4;
    puVar10 = auStack_17bd8 + lVar5 + lVar12 * 4;
    piVar13 = A_ + lVar12 + lVar1 + 4;
    puVar15 = auStack_17bd8 + lVar12 * 4 + lVar1 * -4;
    piVar16 = A_ + ((lVar12 + 4) - lVar1);
    uVar4 = 0;
    piVar11 = piVar14;
    do {
      if ((uVar4 & 1) == 0) {
        if (0 < width) {
          lVar12 = 0;
          do {
            *(int *)((long)flt0 + lVar12) =
                 ((*(int *)((long)piVar13 + lVar12 + -8) + *(int *)((long)piVar16 + lVar12 + -8) +
                   *(int *)((long)piVar16 + lVar12) + *(int *)((long)piVar13 + lVar12)) * 5 +
                 (*(int *)((long)piVar13 + lVar12 + -4) + *(int *)((long)piVar16 + lVar12 + -4)) * 6
                 ) * *(int *)((long)piVar11 + lVar12) +
                 (*(int *)(puVar10 + lVar12 + -8) + *(int *)(puVar15 + lVar12 + -8) +
                  *(int *)(puVar15 + lVar12) + *(int *)(puVar10 + lVar12)) * 5 +
                 (*(int *)(puVar10 + lVar12 + -4) + *(int *)(puVar15 + lVar12 + -4)) * 6 + 0x100 >>
                 9;
            lVar12 = lVar12 + 4;
          } while ((ulong)(uint)width << 2 != lVar12);
        }
      }
      else if (0 < width) {
        lVar12 = 0;
        do {
          *(int *)((long)flt0 + lVar12) =
               ((*(int *)((long)piVar8 + lVar12) + *(int *)((long)piVar8 + lVar12 + -8)) * 5 +
               *(int *)((long)piVar8 + lVar12 + -4) * 6) * *(int *)((long)piVar11 + lVar12) +
               (*(int *)(puVar7 + lVar12) + *(int *)(puVar7 + lVar12 + -8)) * 5 +
               *(int *)(puVar7 + lVar12 + -4) * 6 + 0x80 >> 8;
          lVar12 = lVar12 + 4;
        } while ((ulong)(uint)width << 2 != lVar12);
      }
      uVar4 = uVar4 + 1;
      flt0 = flt0 + flt_stride;
      piVar11 = piVar11 + dgd_stride_00;
      puVar7 = puVar7 + lVar5;
      piVar8 = piVar8 + lVar1;
      puVar10 = puVar10 + lVar5;
      piVar13 = piVar13 + lVar1;
      puVar15 = puVar15 + lVar5;
      piVar16 = piVar16 + lVar1;
    } while (uVar4 != (uint)height);
  }
  if ((0 < av1_sgr_params[sgr_params_idx].r[1]) &&
     (calculate_intermediate_result
                (piVar14,width,height,dgd_stride_00,bit_depth,sgr_params_idx,1,0,A_,aiStack_17be8),
     0 < height)) {
    iVar2 = (width + 9U & 0xfffffffc) + 0x10;
    lVar1 = (long)iVar2;
    lVar12 = (long)(iVar2 * 3);
    puVar7 = auStack_17bd8 + lVar12 * 4;
    lVar5 = lVar1 * 4;
    puVar10 = auStack_17bd8 + lVar5 + lVar12 * 4;
    piVar11 = A_ + lVar12 + lVar1 + 4;
    puVar15 = auStack_17bd8 + lVar12 * 4 + lVar1 * -4;
    piVar13 = A_ + ((lVar12 + 4) - lVar1);
    piVar8 = A_ + lVar12 + 4;
    uVar4 = 0;
    do {
      if (0 < width) {
        lVar12 = 0;
        do {
          *(int *)((long)flt1 + lVar12) =
               (*(int *)(puVar10 + lVar12 + -8) + *(int *)(puVar15 + lVar12 + -8) +
                *(int *)(puVar15 + lVar12) + *(int *)(puVar10 + lVar12)) * 3 +
               (*(int *)(puVar7 + lVar12 + -8) + *(int *)(puVar7 + lVar12 + -4) +
                *(int *)(puVar7 + lVar12) + *(int *)(puVar15 + lVar12 + -4) +
               *(int *)(puVar10 + lVar12 + -4)) * 4 +
               ((*(int *)((long)piVar11 + lVar12 + -8) + *(int *)((long)piVar13 + lVar12 + -8) +
                 *(int *)((long)piVar13 + lVar12) + *(int *)((long)piVar11 + lVar12)) * 3 +
               (*(int *)((long)piVar8 + lVar12 + -8) + *(int *)((long)piVar8 + lVar12 + -4) +
                *(int *)((long)piVar8 + lVar12) + *(int *)((long)piVar13 + lVar12 + -4) +
               *(int *)((long)piVar11 + lVar12 + -4)) * 4) * *(int *)((long)piVar14 + lVar12) +
               0x100 >> 9;
          lVar12 = lVar12 + 4;
        } while ((ulong)(uint)width << 2 != lVar12);
      }
      uVar4 = uVar4 + 1;
      flt1 = flt1 + flt_stride;
      piVar14 = piVar14 + dgd_stride_00;
      puVar7 = puVar7 + lVar5;
      puVar10 = puVar10 + lVar5;
      piVar11 = piVar11 + lVar1;
      puVar15 = puVar15 + lVar5;
      piVar13 = piVar13 + lVar1;
      piVar8 = piVar8 + lVar1;
    } while (uVar4 != (uint)height);
  }
  return 0;
}

Assistant:

int av1_selfguided_restoration_c(const uint8_t *dgd8, int width, int height,
                                 int dgd_stride, int32_t *flt0, int32_t *flt1,
                                 int flt_stride, int sgr_params_idx,
                                 int bit_depth, int highbd) {
  int32_t dgd32_[RESTORATION_PROC_UNIT_PELS];
  const int dgd32_stride = width + 2 * SGRPROJ_BORDER_HORZ;
  int32_t *dgd32 =
      dgd32_ + dgd32_stride * SGRPROJ_BORDER_VERT + SGRPROJ_BORDER_HORZ;

  if (highbd) {
    const uint16_t *dgd16 = CONVERT_TO_SHORTPTR(dgd8);
    for (int i = -SGRPROJ_BORDER_VERT; i < height + SGRPROJ_BORDER_VERT; ++i) {
      for (int j = -SGRPROJ_BORDER_HORZ; j < width + SGRPROJ_BORDER_HORZ; ++j) {
        dgd32[i * dgd32_stride + j] = dgd16[i * dgd_stride + j];
      }
    }
  } else {
    for (int i = -SGRPROJ_BORDER_VERT; i < height + SGRPROJ_BORDER_VERT; ++i) {
      for (int j = -SGRPROJ_BORDER_HORZ; j < width + SGRPROJ_BORDER_HORZ; ++j) {
        dgd32[i * dgd32_stride + j] = dgd8[i * dgd_stride + j];
      }
    }
  }

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));

  if (params->r[0] > 0)
    selfguided_restoration_fast_internal(dgd32, width, height, dgd32_stride,
                                         flt0, flt_stride, bit_depth,
                                         sgr_params_idx, 0);
  if (params->r[1] > 0)
    selfguided_restoration_internal(dgd32, width, height, dgd32_stride, flt1,
                                    flt_stride, bit_depth, sgr_params_idx, 1);
  return 0;
}